

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::internal::PrintOnOneLine(char *str,int max_length)

{
  int local_18;
  int i;
  int max_length_local;
  char *str_local;
  
  if (str != (char *)0x0) {
    local_18 = 0;
    for (_i = str; *_i != '\0'; _i = _i + 1) {
      if (max_length <= local_18) {
        printf("...");
        return;
      }
      if (*_i == '\n') {
        printf("\\n");
        local_18 = local_18 + 2;
      }
      else {
        printf("%c",(ulong)(uint)(int)*_i);
        local_18 = local_18 + 1;
      }
    }
  }
  return;
}

Assistant:

static void PrintOnOneLine(const char* str, int max_length) {
  if (str != NULL) {
    for (int i = 0; *str != '\0'; ++str) {
      if (i >= max_length) {
        printf("...");
        break;
      }
      if (*str == '\n') {
        printf("\\n");
        i += 2;
      } else {
        printf("%c", *str);
        ++i;
      }
    }
  }
}